

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

void __thiscall
pbrt::AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
          (AnimatedShapeSceneEntity *this,AnimatedShapeSceneEntity *param_1)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  undefined3 uVar5;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_38;
  
  (this->super_TransformedSceneEntity).super_SceneEntity.name._M_dataplus._M_p =
       (pointer)&(this->super_TransformedSceneEntity).super_SceneEntity.name.field_2;
  pcVar1 = (param_1->super_TransformedSceneEntity).super_SceneEntity.name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,
             pcVar1 + (param_1->super_TransformedSceneEntity).super_SceneEntity.name.
                      _M_string_length);
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&(this->super_TransformedSceneEntity).super_SceneEntity.parameters.params,
                  &(param_1->super_TransformedSceneEntity).super_SceneEntity.parameters.params,
                  &local_38);
  (this->super_TransformedSceneEntity).super_SceneEntity.parameters.colorSpace =
       (param_1->super_TransformedSceneEntity).super_SceneEntity.parameters.colorSpace;
  pcVar2 = (param_1->super_TransformedSceneEntity).super_SceneEntity.loc.filename._M_str;
  (this->super_TransformedSceneEntity).super_SceneEntity.loc.filename._M_len =
       (param_1->super_TransformedSceneEntity).super_SceneEntity.loc.filename._M_len;
  (this->super_TransformedSceneEntity).super_SceneEntity.loc.filename._M_str = pcVar2;
  iVar3 = (param_1->super_TransformedSceneEntity).super_SceneEntity.loc.column;
  (this->super_TransformedSceneEntity).super_SceneEntity.loc.line =
       (param_1->super_TransformedSceneEntity).super_SceneEntity.loc.line;
  (this->super_TransformedSceneEntity).super_SceneEntity.loc.column = iVar3;
  memcpy(&(this->super_TransformedSceneEntity).renderFromObject,
         &(param_1->super_TransformedSceneEntity).renderFromObject,0x2b8);
  bVar4 = param_1->reverseOrientation;
  uVar5 = *(undefined3 *)&param_1->field_0x361;
  iVar3 = param_1->materialIndex;
  this->identity = param_1->identity;
  this->reverseOrientation = bVar4;
  *(undefined3 *)&this->field_0x361 = uVar5;
  this->materialIndex = iVar3;
  (this->materialName)._M_dataplus._M_p = (pointer)&(this->materialName).field_2;
  pcVar1 = (param_1->materialName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->materialName,pcVar1,pcVar1 + (param_1->materialName)._M_string_length)
  ;
  this->lightIndex = param_1->lightIndex;
  (this->insideMedium)._M_dataplus._M_p = (pointer)&(this->insideMedium).field_2;
  pcVar1 = (param_1->insideMedium)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->insideMedium,pcVar1,pcVar1 + (param_1->insideMedium)._M_string_length)
  ;
  (this->outsideMedium)._M_dataplus._M_p = (pointer)&(this->outsideMedium).field_2;
  pcVar1 = (param_1->outsideMedium)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->outsideMedium,pcVar1,
             pcVar1 + (param_1->outsideMedium)._M_string_length);
  return;
}

Assistant:

AnimatedShapeSceneEntity(const std::string &name, ParameterDictionary parameters,
                             FileLoc loc, const AnimatedTransform &renderFromObject,
                             const Transform *identity, bool reverseOrientation,
                             int materialIndex, const std::string &materialName,
                             int lightIndex, const std::string &insideMedium,
                             const std::string &outsideMedium)
        : TransformedSceneEntity(name, parameters, loc, renderFromObject),
          identity(identity),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}